

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O2

plain_range_sorted<int>
partition_binary<plain_range_sorted<int>,int>(plain_range_sorted<int> range,int value)

{
  int *piVar1;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar2;
  int *piVar3;
  uint uVar4;
  long in_FS_OFFSET;
  plain_range_sorted<int> pVar5;
  plain_range<int> local_30;
  long local_20;
  
  local_30.end = range.super_plain_range<int>.end;
  local_30.begin = range.super_plain_range<int>.begin;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  piVar1 = local_30.end;
  piVar3 = local_30.begin;
  if (local_30.begin < local_30.end) {
    piVar1 = plain_range<int>::back(&local_30);
    if (*piVar1 < value) {
      piVar1 = (int *)0x0;
      piVar3 = (int *)0x0;
    }
    else {
      uVar2 = extraout_RDX;
      while (uVar4 = (uint)((ulong)((long)local_30.end - (long)local_30.begin) >> 2),
            piVar1 = local_30.end, piVar3 = local_30.begin, 1 < uVar4) {
        uVar4 = uVar4 - 1 >> 1;
        piVar1 = (int *)plain_range<int>::index(&local_30,(char *)(ulong)uVar4,(int)uVar2);
        uVar4 = uVar4 + 1;
        if (*piVar1 < value) {
          uVar2 = (ulong)((int)((ulong)((long)local_30.end - (long)local_30.begin) >> 2) - 1);
          local_30.begin = local_30.begin + uVar4;
          local_30.end = local_30.begin + uVar2;
        }
        else {
          local_30.end = local_30.begin + uVar4;
          uVar2 = extraout_RDX_00;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  pVar5.super_plain_range<int>.end = piVar1;
  pVar5.super_plain_range<int>.begin = piVar3;
  return (plain_range_sorted<int>)pVar5.super_plain_range<int>;
}

Assistant:

R partition_binary(R range, T value)
{
	concept_empty::check(range);
	concept_index::check(range);
	concept_size::check(range);
	concept_slice::check(range);
	concept_sorted::check(range);

	if(range.empty())
		return range;
	if(range.back() < value)
		return R();

	while(range.size() > 1)
	{
		unsigned pivot = (range.size()-1)/2;
		if(range.index(pivot) < value)
			range = range.slice(pivot+1, range.size()-1);
		else
			range = range.slice(0, pivot+1);
	}
	return range;
}